

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

void __thiscall
soul::HTMLGenerator::printTOCNode
          (HTMLGenerator *this,HTMLElement *parent,TableOfContentsNode *node,bool isRoot)

{
  Module *pMVar1;
  File *pFVar2;
  pointer pTVar3;
  HTMLElement *pHVar4;
  undefined7 in_register_00000009;
  TableOfContentsNode *n;
  pointer node_00;
  string_view value;
  string_view linkURL;
  string_view text;
  string_view value_00;
  string_view linkURL_00;
  string_view text_00;
  string_view value_01;
  string_view value_02;
  string_view text_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000009,isRoot) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"li",(allocator<char> *)&local_90);
    parent = choc::html::HTMLElement::addChild(parent,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pMVar1 = node->module;
    if (pMVar1 == (Module *)0x0) {
      pFVar2 = node->file;
      if (pFVar2 == (File *)0x0) {
        value_02._M_str = "toc_item";
        value_02._M_len = 8;
        pHVar4 = choc::html::HTMLElement::setClass(parent,value_02);
        text_01._M_str = (node->name)._M_dataplus._M_p;
        text_01._M_len = (node->name)._M_string_length;
        choc::html::HTMLElement::addContent(pHVar4,text_01);
        goto LAB_0028c143;
      }
      value_00._M_str = "toc_module";
      value_00._M_len = 10;
      pHVar4 = choc::html::HTMLElement::setClass(parent,value_00);
      std::operator+(&local_90,"#",&pFVar2->UID);
      linkURL_00._M_str = local_90._M_dataplus._M_p;
      linkURL_00._M_len = local_90._M_string_length;
      pHVar4 = choc::html::HTMLElement::addLink(pHVar4,linkURL_00);
      text_00._M_str = (node->name)._M_dataplus._M_p;
      text_00._M_len = (node->name)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar4,text_00);
    }
    else {
      value._M_str = "toc_item";
      value._M_len = 8;
      pHVar4 = choc::html::HTMLElement::setClass(parent,value);
      std::operator+(&local_90,"#",&pMVar1->UID);
      linkURL._M_str = local_90._M_dataplus._M_p;
      linkURL._M_len = local_90._M_string_length;
      pHVar4 = choc::html::HTMLElement::addLink(pHVar4,linkURL);
      text._M_str = (node->name)._M_dataplus._M_p;
      text._M_len = (node->name)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar4,text);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
LAB_0028c143:
  if ((node->children).
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (node->children).
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"ul",(allocator<char> *)&local_90);
    pHVar4 = choc::html::HTMLElement::addChild(parent,&local_70);
    value_01._M_str = "toc_item";
    value_01._M_len = 8;
    pHVar4 = choc::html::HTMLElement::setClass(pHVar4,value_01);
    std::__cxx11::string::~string((string *)&local_70);
    pTVar3 = (node->children).
             super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (node_00 = (node->children).
                   super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; node_00 != pTVar3;
        node_00 = node_00 + 1) {
      printTOCNode(this,pHVar4,node_00,false);
    }
  }
  return;
}

Assistant:

void printTOCNode (choc::html::HTMLElement& parent, const SourceCodeModel::TableOfContentsNode& node, bool isRoot)
    {
        auto p = &parent;

        if (! isRoot)
        {
            auto& li = parent.addChild ("li");

            if (auto m = node.module)
                li.setClass ("toc_item").addLink ("#" + m->UID).addContent (node.name);
            else if (auto f = node.file)
                li.setClass ("toc_module").addLink ("#" + f->UID).addContent (node.name);
            else
                li.setClass ("toc_item").addContent (node.name);

            p = &li;
        }

        if (! node.children.empty())
        {
            auto& ul = p->addChild ("ul").setClass ("toc_item");

            for (auto& n : node.children)
                printTOCNode (ul, n, false);
        }
    }